

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void cpptempl::parse_tree(token_vector *tokens,token_vector *tree,TokenType until)

{
  bool bVar1;
  int iVar2;
  TokenType TVar3;
  iterator __position;
  token_ptr token;
  token_vector children;
  value_type local_60;
  TokenType local_4c;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  local_48;
  
  local_4c = until;
  do {
    __position._M_current =
         (tokens->
         super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (tokens->
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ((__position._M_current)->super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((__position._M_current)->super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
        __position._M_current =
             (tokens->
             super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    _M_erase(tokens,__position);
    iVar2 = (**(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_Token)();
    if (iVar2 == 4) {
      local_48.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parse_tree(tokens,&local_48,TOKEN_TYPE_ENDFOR);
      (*(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Token[2])(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&local_48);
LAB_001482ee:
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      ~vector(&local_48);
LAB_001482f6:
      bVar1 = true;
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      push_back(tree,&local_60);
    }
    else {
      iVar2 = (**(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_Token)();
      if (iVar2 == 3) {
        local_48.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        parse_tree(tokens,&local_48,TOKEN_TYPE_ENDIF);
        (*(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Token[2])(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&local_48);
        goto LAB_001482ee;
      }
      TVar3 = (**(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_Token)();
      if (TVar3 != local_4c) goto LAB_001482f6;
      bVar1 = false;
    }
    if (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

inline void parse_tree(token_vector &tokens, token_vector &tree, TokenType until)
    {
        while(! tokens.empty())
        {
            // 'pops' first item off list
            token_ptr token = tokens[0] ;
            tokens.erase(tokens.begin()) ;

            if (token->gettype() == TOKEN_TYPE_FOR)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDFOR) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == TOKEN_TYPE_IF)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDIF) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == until)
            {
                return ;
            }
            tree.push_back(token) ;
        }
    }